

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  int iVar1;
  size_t sVar2;
  secp256k1_context *ret;
  size_t prealloc_size;
  uint flags_local;
  void *prealloc_local;
  
  iVar1 = secp256k1_selftest();
  if (iVar1 == 0) {
    secp256k1_callback_call(&default_error_callback,"self test failed");
  }
  sVar2 = secp256k1_context_preallocated_size(flags);
  if (sVar2 == 0) {
    prealloc_local = (void *)0x0;
  }
  else {
    *(code **)((long)prealloc + 0xa8) = secp256k1_default_illegal_callback_fn;
    *(void **)((long)prealloc + 0xb0) = (void *)0x0;
    *(code **)((long)prealloc + 0xb8) = secp256k1_default_error_callback_fn;
    *(void **)((long)prealloc + 0xc0) = (void *)0x0;
    secp256k1_ecmult_gen_context_build((secp256k1_ecmult_gen_context *)prealloc);
    *(uint *)((long)prealloc + 200) = (uint)((flags & 0x400) != 0);
    prealloc_local = prealloc;
  }
  return (secp256k1_context *)prealloc_local;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)prealloc;
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx);
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return ret;
}